

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_all_live_ranges(gen_ctx_t gen_ctx)

{
  MIR_context_t ctx;
  FILE *pFVar1;
  void *pvVar2;
  gen_ctx_t bm;
  bitmap_t pVVar3;
  ulong uVar4;
  void **ppvVar5;
  int iVar6;
  MIR_type_t tp;
  char *pcVar7;
  lr_ctx *plVar8;
  live_range_t_conflict plVar9;
  int start;
  VARR_live_range_t *pVVar10;
  live_range_t_conflict *pplVar11;
  MIR_item_t pMVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  uint start_00;
  ulong uVar13;
  uint uVar14;
  live_range_t_conflict plVar15;
  live_range_t_conflict nb;
  size_t nb_00;
  char *pcVar16;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t pgVar17;
  int iVar18;
  undefined8 in_R8;
  ulong uVar19;
  MIR_reg_t reg;
  
  ctx = gen_ctx->ctx;
  pcVar16 = "+++++++++++++Live ranges:\n";
  plVar15 = (live_range_t_conflict)0x1a;
  fwrite("+++++++++++++Live ranges:\n",0x1a,1,(FILE *)gen_ctx->debug_file);
  plVar8 = gen_ctx->lr_ctx;
  pVVar10 = plVar8->var_live_ranges;
  if (pVVar10 != (VARR_live_range_t *)0x0) {
    uVar13 = 0;
    do {
      iVar6 = (int)in_R8;
      if (pVVar10->els_num <= uVar13) {
        return;
      }
      pplVar11 = pVVar10->varr;
      if (pplVar11 == (live_range_t_conflict *)0x0) {
        print_all_live_ranges_cold_1();
        plVar8 = ((gen_ctx_t)pcVar16)->lr_ctx;
        start = (int)pplVar11;
        pVVar10 = plVar8->var_live_ranges;
        iVar18 = iVar6;
        if (((pVVar10 == (VARR_live_range_t *)0x0) ||
            (pVVar10->varr == (live_range_t_conflict *)0x0)) ||
           (uVar13 = (ulong)plVar15 & 0xffffffff, pVVar10->els_num <= uVar13)) {
          make_var_live_cold_4();
LAB_0016da3f:
          make_var_live_cold_2();
          nb = plVar15;
          gen_ctx_00 = (gen_ctx_t)pcVar16;
LAB_0016da44:
          make_var_live_cold_3();
        }
        else {
          plVar9 = pVVar10->varr[uVar13];
          if ((iVar6 == 0) || (plVar8->scan_vars_num != 0)) {
LAB_0016d983:
            pgVar17 = (gen_ctx_t)plVar8->live_vars;
            uVar19 = (ulong)extraout_EDX;
            nb = (live_range_t_conflict)(uVar19 + 1);
            gen_ctx_00 = pgVar17;
            bitmap_expand((bitmap_t)pgVar17,(size_t)nb);
            if (pgVar17 != (gen_ctx_t)0x0) {
              pvVar2 = (&pgVar17->curr_func_item->data)[uVar19 >> 6];
              (&pgVar17->curr_func_item->data)[uVar19 >> 6] =
                   (void *)((ulong)pvVar2 | 1L << (uVar19 & 0x3f));
              if ((((ulong)pvVar2 >> (uVar19 & 0x3f) & 1) != 0) ||
                 (((iVar6 != 0 && (plVar9 != (live_range_t_conflict)0x0)) &&
                  ((plVar9->lr_bb == (lr_bb_t_conflict)0x0 &&
                   (plVar9->finish + 1 == start || plVar9->finish == start)))))) {
                return;
              }
              plVar15 = (live_range_t_conflict)((ulong)pplVar11 & 0xffffffff);
              pVVar10 = ((gen_ctx_t)pcVar16)->lr_ctx->var_live_ranges;
              plVar9 = create_live_range((gen_ctx_t)pcVar16,start,-1,plVar9);
              if (((pVVar10 != (VARR_live_range_t *)0x0) &&
                  (pVVar10->varr != (live_range_t_conflict *)0x0)) && (uVar13 < pVVar10->els_num)) {
                pVVar10->varr[uVar13] = plVar9;
                return;
              }
              goto LAB_0016da3f;
            }
            goto LAB_0016da44;
          }
          pgVar17 = (gen_ctx_t)plVar8->referenced_vars;
          nb = (live_range_t_conflict)(uVar13 + 1);
          gen_ctx_00 = pgVar17;
          bitmap_expand((bitmap_t)pgVar17,(size_t)nb);
          if (pgVar17 != (gen_ctx_t)0x0) {
            ppvVar5 = &pgVar17->curr_func_item->data + (uVar13 >> 6);
            *ppvVar5 = (void *)((ulong)*ppvVar5 | 1L << ((ulong)plVar15 & 0x3f));
            plVar8 = ((gen_ctx_t)pcVar16)->lr_ctx;
            goto LAB_0016d983;
          }
        }
        make_var_live_cold_1();
        if (*(int *)((long)&gen_ctx_00->ctx + 4) == 0) {
          return;
        }
        if ((int)nb < 0) {
LAB_0016da80:
          __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
        }
        pMVar12 = gen_ctx_00->curr_func_item;
        if (pMVar12 == (MIR_item_t)0x0) {
          scan_var_to_var_cold_2();
        }
        else {
          ppvVar5 = &pMVar12->data;
          if ((int)*ppvVar5 <= (int)nb) goto LAB_0016da80;
          pMVar12 = (pMVar12->item_link).prev;
          if ((pMVar12 != (MIR_item_t)0x0) && ((void *)((ulong)nb & 0xffffffff) < *ppvVar5)) {
            return;
          }
        }
        scan_var_to_var_cold_1();
        uVar14 = (uint)nb;
        start_00 = (uint)pMVar12;
        uVar13 = (ulong)nb & 0xffffffff;
        pgVar17 = gen_ctx_00;
        if ((iVar18 != 0) && (gen_ctx_00->lr_ctx->scan_vars_num == 0)) {
          bm = (gen_ctx_t)gen_ctx_00->lr_ctx->referenced_vars;
          nb_00 = uVar13 + 1;
          pgVar17 = bm;
          bitmap_expand((bitmap_t)bm,nb_00);
          uVar14 = (uint)nb_00;
          if (bm == (gen_ctx_t)0x0) goto LAB_0016db94;
          pMVar12 = (MIR_item_t)(uVar13 >> 6);
          ppvVar5 = &bm->curr_func_item->data + (long)pMVar12;
          *ppvVar5 = (void *)((ulong)*ppvVar5 | 1L << ((ulong)nb & 0x3f));
        }
        pVVar10 = gen_ctx_00->lr_ctx->var_live_ranges;
        if (((pVVar10 == (VARR_live_range_t *)0x0) ||
            (pMVar12 = (MIR_item_t)pVVar10->varr, pMVar12 == (MIR_item_t)0x0)) ||
           (pVVar10->els_num <= uVar13)) {
          make_var_dead_cold_4();
LAB_0016db8a:
          make_var_dead_cold_2();
        }
        else {
          pVVar3 = gen_ctx_00->lr_ctx->live_vars;
          if (pVVar3 != (bitmap_t)0x0) {
            plVar15 = (live_range_t_conflict)(&pMVar12->data)[uVar13];
            uVar19 = (ulong)extraout_EDX_00;
            if ((uVar19 < pVVar3->els_num << 6) &&
               (uVar4 = pVVar3->varr[uVar19 >> 6],
               pVVar3->varr[uVar19 >> 6] = uVar4 & ~(1L << (uVar19 & 0x3f)),
               (uVar4 >> (uVar19 & 0x3f) & 1) != 0)) {
              plVar15->finish = start_00;
              return;
            }
            uVar14 = start_00;
            plVar15 = create_live_range(gen_ctx_00,start_00,start_00,plVar15);
            pMVar12 = (MIR_item_t)pVVar10->varr;
            pgVar17 = gen_ctx_00;
            if ((pMVar12 != (MIR_item_t)0x0) && (uVar13 < pVVar10->els_num)) {
              (&pMVar12->data)[uVar13] = plVar15;
              return;
            }
            goto LAB_0016db8a;
          }
        }
        make_var_dead_cold_3();
LAB_0016db94:
        make_var_dead_cold_1();
        plVar15 = pgVar17->lr_ctx->free_lr_list;
        if (plVar15 == (live_range_t_conflict)0x0) {
          plVar15 = (live_range_t_conflict)gen_malloc(pgVar17,0x20);
        }
        else {
          pgVar17->lr_ctx->free_lr_list = plVar15->next;
        }
        if (-1 < (int)uVar14) {
          if (uVar14 <= extraout_EDX_01) {
            plVar15->start = uVar14;
            plVar15->finish = extraout_EDX_01;
            plVar15->ref_cost = 1;
            plVar15->next = (live_range_t)pMVar12;
            plVar15->lr_bb = (lr_bb_t_conflict)0x0;
            return;
          }
          __assert_fail("finish < 0 || start <= finish",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        __assert_fail("start >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
      }
      plVar9 = pplVar11[uVar13];
      if (plVar9 != (live_range_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"%lu",uVar13);
        if (*(int *)((long)&((gen_ctx_t)gen_ctx->lr_ctx)->ctx + 4) != 0) {
          pFVar1 = (FILE *)gen_ctx->debug_file;
          iVar6 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,(MIR_reg_t)uVar13);
          fprintf(pFVar1," (%lu)",(long)iVar6);
        }
        if (0x21 < uVar13) {
          pFVar1 = (FILE *)gen_ctx->debug_file;
          reg = (MIR_reg_t)uVar13 - 0x21;
          tp = MIR_reg_type(ctx,reg,(gen_ctx->curr_func_item->u).func);
          pcVar16 = MIR_type_str(ctx,tp);
          pcVar7 = MIR_reg_name(ctx,reg,(gen_ctx->curr_func_item->u).func);
          fprintf(pFVar1," (%s:%s)",pcVar16,pcVar7);
        }
        fputc(0x3a,(FILE *)gen_ctx->debug_file);
        pcVar16 = (char *)gen_ctx;
        print_live_ranges(gen_ctx,plVar9);
        plVar8 = gen_ctx->lr_ctx;
        plVar15 = plVar9;
      }
      pVVar10 = plVar8->var_live_ranges;
      uVar13 = uVar13 + 1;
    } while (pVVar10 != (VARR_live_range_t *)0x0);
  }
  print_all_live_ranges_cold_2();
  return;
}

Assistant:

static void print_all_live_ranges (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  live_range_t lr;

  fprintf (debug_file, "+++++++++++++Live ranges:\n");
  for (size_t i = 0; i < VARR_LENGTH (live_range_t, var_live_ranges); i++) {
    if ((lr = VARR_GET (live_range_t, var_live_ranges, i)) == NULL) continue;
    fprintf (debug_file, "%lu", (unsigned long) i);
    if (scan_vars_num != 0)
      fprintf (debug_file, " (%lu)", (unsigned long) var_to_scan_var (gen_ctx, (MIR_reg_t) i));
    if (i > MAX_HARD_REG)
      fprintf (debug_file, " (%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, (MIR_reg_t) (i - MAX_HARD_REG),
                                                curr_func_item->u.func)),
               MIR_reg_name (ctx, (MIR_reg_t) (i - MAX_HARD_REG), curr_func_item->u.func));
    fprintf (debug_file, ":");
    print_live_ranges (gen_ctx, lr);
  }
}